

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSAtom JS_NewAtomUInt32(JSContext *ctx,uint32_t n)

{
  JSAtom JVar1;
  int iVar2;
  uint in_ESI;
  JSString *in_RDI;
  JSValue v;
  JSValue val;
  char buf [11];
  char *local_40;
  JSContext *in_stack_ffffffffffffffd0;
  char local_1f [11];
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_ESI < 0x80000000) {
    JVar1 = __JS_AtomFromUInt32(in_ESI);
  }
  else {
    snprintf(local_1f,0xb,"%u",(ulong)in_ESI);
    v = JS_NewString(in_stack_ffffffffffffffd0,local_40);
    iVar2 = JS_IsException(v);
    if (iVar2 == 0) {
      JVar1 = __JS_NewAtom((JSRuntime *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                           in_ESI);
    }
    else {
      JVar1 = 0;
    }
  }
  return JVar1;
}

Assistant:

JSAtom JS_NewAtomUInt32(JSContext *ctx, uint32_t n)
{
    if (n <= JS_ATOM_MAX_INT) {
        return __JS_AtomFromUInt32(n);
    } else {
        char buf[11];
        JSValue val;
        snprintf(buf, sizeof(buf), "%u", n);
        val = JS_NewString(ctx, buf);
        if (JS_IsException(val))
            return JS_ATOM_NULL;
        return __JS_NewAtom(ctx->rt, JS_VALUE_GET_STRING(val),
                            JS_ATOM_TYPE_STRING);
    }
}